

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::StencilTexturing::FunctionalTest::iterate(FunctionalTest *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  undefined1 local_198 [384];
  
  bVar2 = test(this,0x88f0,true);
  if (!bVar2) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Test failed. Case format: GL_DEPTH24_STENCIL8, channel: S");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  bVar3 = test(this,0x88f0,false);
  if (!bVar3) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Test failed. Case format: GL_DEPTH24_STENCIL8, channel: D");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar2 = false;
  }
  bVar3 = test(this,0x8cad,true);
  if (!bVar3) {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Test failed. Case format: GL_DEPTH32F_STENCIL8, channel: S");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    bVar2 = false;
  }
  bVar3 = test(this,0x8cad,false);
  if (bVar3) {
    if (bVar2 != false) {
      this_00 = ((this->super_TestCase).m_context)->m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00a796c1;
    }
  }
  else {
    local_198._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Test failed. Case format: GL_DEPTH32F_STENCIL8, channel: D");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  this_00 = ((this->super_TestCase).m_context)->m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00a796c1:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	bool test_result = true;

	if (false == test(GL_DEPTH24_STENCIL8, true))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Test failed. Case format: GL_DEPTH24_STENCIL8, channel: S"
											<< tcu::TestLog::EndMessage;
		test_result = false;
	}

	if (false == test(GL_DEPTH24_STENCIL8, false))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Test failed. Case format: GL_DEPTH24_STENCIL8, channel: D"
											<< tcu::TestLog::EndMessage;
		test_result = false;
	}

	if (false == test(GL_DEPTH32F_STENCIL8, true))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Test failed. Case format: GL_DEPTH32F_STENCIL8, channel: S"
											<< tcu::TestLog::EndMessage;
		test_result = false;
	}

	if (false == test(GL_DEPTH32F_STENCIL8, false))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Test failed. Case format: GL_DEPTH32F_STENCIL8, channel: D"
											<< tcu::TestLog::EndMessage;
		test_result = false;
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}